

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::~Vector
          (Vector<capnp::compiler::NodeTranslator::UnfinishedValue> *this)

{
  UnfinishedValue *pUVar1;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar2;
  UnfinishedValue *pUVar3;
  ArrayDisposer *pAVar4;
  
  pUVar1 = (this->builder).ptr;
  if (pUVar1 != (UnfinishedValue *)0x0) {
    pRVar2 = (this->builder).pos;
    pUVar3 = (this->builder).endPtr;
    (this->builder).ptr = (UnfinishedValue *)0x0;
    (this->builder).pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
    (this->builder).endPtr = (UnfinishedValue *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pUVar1,0x98,((long)pRVar2 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               ((long)pUVar3 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::UnfinishedValue>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }